

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgpsec.c
# Opt level: O0

int rtr_bgpsec_has_algorithm_suite(uint8_t alg_suite)

{
  long in_FS_OFFSET;
  int local_20;
  int i;
  int alg_suites_len;
  uint8_t alg_suite_local;
  
  local_20 = 0;
  do {
    if (0 < local_20) {
      alg_suites_len = -1;
LAB_0011a695:
      if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
        return alg_suites_len;
      }
      __stack_chk_fail();
    }
    if (alg_suite == "\x01"[local_20]) {
      alg_suites_len = 0;
      goto LAB_0011a695;
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

int rtr_bgpsec_has_algorithm_suite(uint8_t alg_suite)
{
	int alg_suites_len = sizeof(algorithm_suites) / sizeof(uint8_t);

	for (int i = 0; i < alg_suites_len; i++) {
		if (alg_suite == algorithm_suites[i])
			return RTR_BGPSEC_SUCCESS;
	}

	return RTR_BGPSEC_ERROR;
}